

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::ExpandListArgument
               (string *arg,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newargs,bool emptyArgs)

{
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  char *next;
  char *c;
  char *pcStack_48;
  int squareNesting;
  char *last;
  string newArg;
  bool emptyArgs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *newargs_local;
  string *arg_local;
  
  newArg.field_2._M_local_buf[0xf] = emptyArgs;
  if ((emptyArgs) || (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
    lVar2 = std::__cxx11::string::find((char)arg,0x3b);
    if (lVar2 == -1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(newargs,arg);
    }
    else {
      std::__cxx11::string::string((string *)&last);
      next = (char *)std::__cxx11::string::c_str();
      c._4_4_ = 0;
      pcStack_48 = next;
      for (; *next != '\0'; next = next + 1) {
        switch(*next) {
        case ';':
          if (c._4_4_ == 0) {
            std::__cxx11::string::append((char *)&last,(ulong)pcStack_48);
            pcStack_48 = next + 1;
            uVar1 = std::__cxx11::string::empty();
            if (((uVar1 & 1) == 0) || ((newArg.field_2._M_local_buf[0xf] & 1U) != 0)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(newargs,(value_type *)&last);
              std::__cxx11::string::clear();
            }
          }
          break;
        default:
          break;
        case '[':
          c._4_4_ = c._4_4_ + 1;
          break;
        case '\\':
          pcVar3 = next + 1;
          if (*pcVar3 == ';') {
            std::__cxx11::string::append((char *)&last,(ulong)pcStack_48);
            next = pcVar3;
            pcStack_48 = pcVar3;
          }
          break;
        case ']':
          c._4_4_ = c._4_4_ + -1;
        }
      }
      std::__cxx11::string::append((char *)&last);
      uVar1 = std::__cxx11::string::empty();
      if (((uVar1 & 1) == 0) || ((newArg.field_2._M_local_buf[0xf] & 1U) != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(newargs,(value_type *)&last);
      }
      std::__cxx11::string::~string((string *)&last);
    }
  }
  return;
}

Assistant:

void cmSystemTools::ExpandListArgument(const std::string& arg,
                                       std::vector<std::string>& newargs,
                                       bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if (!emptyArgs && arg.empty()) {
    return;
  }
  // if there are no ; in the name then just copy the current string
  if (arg.find(';') == std::string::npos) {
    newargs.push_back(arg);
    return;
  }
  std::string newArg;
  const char* last = arg.c_str();
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  for (const char* c = last; *c; ++c) {
    switch (*c) {
      case '\\': {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        const char* next = c + 1;
        if (*next == ';') {
          newArg.append(last, c - last);
          // Skip over the escape character
          last = c = next;
        }
      } break;
      case '[': {
        ++squareNesting;
      } break;
      case ']': {
        --squareNesting;
      } break;
      case ';': {
        // Break the string here if we are not nested inside square
        // brackets.
        if (squareNesting == 0) {
          newArg.append(last, c - last);
          // Skip over the semicolon
          last = c + 1;
          if (!newArg.empty() || emptyArgs) {
            // Add the last argument if the string is not empty.
            newargs.push_back(newArg);
            newArg.clear();
          }
        }
      } break;
      default: {
        // Just append this character.
      } break;
    }
  }
  newArg.append(last);
  if (!newArg.empty() || emptyArgs) {
    // Add the last argument if the string is not empty.
    newargs.push_back(newArg);
  }
}